

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamWriter::writeTextElement
          (QXmlStreamWriter *this,QAnyStringView qualifiedName,QAnyStringView text)

{
  long lVar1;
  QAnyStringView text_00;
  QAnyStringView qualifiedName_00;
  size_t in_RSI;
  QXmlStreamWriter *in_RDI;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_R8;
  long in_FS_OFFSET;
  QXmlStreamWriter *in_stack_00000068;
  QXmlStreamWriter *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qualifiedName_00.m_size = in_RSI;
  qualifiedName_00.field_0.m_data = in_R8.m_data;
  writeStartElement(in_stack_ffffffffffffffb8,qualifiedName_00);
  text_00.m_size = in_RSI;
  text_00.field_0.m_data = in_R8.m_data;
  writeCharacters(in_RDI,text_00);
  writeEndElement(in_stack_00000068);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriter::writeTextElement(QAnyStringView qualifiedName, QAnyStringView text)
{
    writeStartElement(qualifiedName);
    writeCharacters(text);
    writeEndElement();
}